

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinside.hpp
# Opt level: O2

void __thiscall duckdb::JoinCondition::~JoinCondition(JoinCondition *this)

{
  ::std::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::~unique_ptr
            (&(this->right).
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>);
  ::std::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)this);
  return;
}

Assistant:

JoinCondition() {
	}